

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O2

bool google::protobuf::compiler::csharp::RequiresPresenceBit(FieldDescriptor *descriptor)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  
  bVar1 = SupportsPresenceApi(descriptor);
  if (((bVar1) && (bVar1 = IsNullable(descriptor), !bVar1)) && (((byte)descriptor[1] & 8) == 0)) {
    pOVar2 = FieldDescriptor::real_containing_oneof(descriptor);
    return pOVar2 == (OneofDescriptor *)0x0;
  }
  return false;
}

Assistant:

inline bool RequiresPresenceBit(const FieldDescriptor* descriptor) {
  return SupportsPresenceApi(descriptor) &&
    !IsNullable(descriptor) &&
    !descriptor->is_extension() &&
    !descriptor->real_containing_oneof();
}